

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subset_iterator.hpp
# Opt level: O0

subset_iterator<std::_List_iterator<int>,_std::less<void>,_std::vector<std::_List_iterator<int>,_std::allocator<std::_List_iterator<int>_>_>_>
* __thiscall
burst::make_subset_iterator<std::__cxx11::list<int,std::allocator<int>>&>
          (subset_iterator<std::_List_iterator<int>,_std::less<void>,_std::vector<std::_List_iterator<int>,_std::allocator<std::_List_iterator<int>_>_>_>
           *__return_storage_ptr__,burst *this,list<int,_std::allocator<int>_> *range)

{
  iterator this_00;
  iterator first;
  _List_iterator<int> in_RCX;
  list<int,_std::allocator<int>_> *range_local;
  
  this_00 = std::begin<std::__cxx11::list<int,std::allocator<int>>>
                      ((list<int,_std::allocator<int>_> *)this);
  first = std::end<std::__cxx11::list<int,std::allocator<int>>>
                    ((list<int,_std::allocator<int>_> *)this);
  make_subset_iterator<std::_List_iterator<int>>
            (__return_storage_ptr__,(burst *)this_00._M_node,(_List_iterator<int>)first._M_node,
             in_RCX);
  return __return_storage_ptr__;
}

Assistant:

auto make_subset_iterator (ForwardRange && range)
    {
        using std::begin;
        using std::end;
        return
            make_subset_iterator
            (
                begin(std::forward<ForwardRange>(range)),
                end(std::forward<ForwardRange>(range))
            );
    }